

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

bool __thiscall ON_MeshTopology::IsValid(ON_MeshTopology *this)

{
  ON_MeshTopologyFace *pOVar1;
  ON_MeshTopologyEdge *pOVar2;
  int mesh_vertex_count;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  ON_Mesh *pOVar13;
  ON_MeshTopologyEdge *pOVar14;
  uint *puVar15;
  ON_MeshTopologyFace *pOVar16;
  long lVar17;
  bool bVar18;
  int iVar19;
  void *__s;
  size_t sVar20;
  ulong uVar21;
  ON_MeshTopology *top;
  long lVar22;
  size_t size;
  ON_MeshFace *this_00;
  ulong uVar23;
  long lVar24;
  ON_MeshTopologyVertex *pOVar25;
  ulong uVar26;
  int *piVar27;
  int tfvi [4];
  ON_Workspace ws;
  ON_3fPoint p;
  int local_98 [6];
  ON_MeshTopologyFace *local_80;
  ON_MeshFace *local_78;
  int *local_70;
  ON_Workspace local_68;
  ON_3fPoint local_54;
  ON_3dPoint local_48;
  
  ON_Workspace::ON_Workspace(&local_68);
  if ((this->m_b32IsValid == 1) && (pOVar13 = this->m_mesh, pOVar13 != (ON_Mesh *)0x0)) {
    if ((pOVar13->m_top).m_b32IsValid == 0) {
      (pOVar13->m_top).m_mesh = pOVar13;
      bVar18 = Create(&pOVar13->m_top);
      (pOVar13->m_top).m_b32IsValid = (uint)bVar18;
    }
    if (&pOVar13->m_top == this) {
      mesh_vertex_count = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      size = (size_t)mesh_vertex_count;
      uVar3 = (this->m_topv).m_count;
      if (-1 < (int)uVar3 && (int)uVar3 <= mesh_vertex_count) {
        bVar18 = false;
        if (mesh_vertex_count < 1 || (ulong)uVar3 != 0) {
          uVar4 = (this->m_mesh->m_F).m_count;
          if ((this->m_topf).m_count == uVar4) {
            uVar5 = (this->m_tope).m_count;
            bVar18 = false;
            if (((int)uVar4 < 1 || 2 < (int)uVar5) &&
               (bVar18 = false, (this->m_topv_map).m_count == mesh_vertex_count)) {
              if (0 < mesh_vertex_count) {
                sVar20 = 0;
                do {
                  if (uVar3 <= (uint)(this->m_topv_map).m_a[sVar20]) goto LAB_00513ca3;
                  sVar20 = sVar20 + 1;
                } while (size != sVar20);
              }
              __s = ON_Workspace::GetMemory(&local_68,size);
              memset(__s,0,size);
              if (0 < (int)uVar3) {
                uVar21 = 0;
                do {
                  pOVar25 = (this->m_topv).m_a;
                  if ((pOVar25[uVar21].m_v_count < 1) ||
                     (pOVar25 = pOVar25 + uVar21, pOVar25->m_vi == (int *)0x0)) goto LAB_00513ca3;
                  TopVertexPoint(&local_48,this,(int)uVar21);
                  ON_3fPoint::operator=(&local_54,&local_48);
                  if (0 < pOVar25->m_v_count) {
                    lVar24 = 0;
                    do {
                      lVar22 = (long)pOVar25->m_vi[lVar24];
                      bVar18 = false;
                      if ((lVar22 < 0) || (mesh_vertex_count <= pOVar25->m_vi[lVar24]))
                      goto LAB_00513ca5;
                      if ((*(char *)((long)__s + lVar22) != '\0') ||
                         ((iVar19 = compare3fPoint(&local_54,
                                                   (this->m_mesh->m_V).
                                                   super_ON_SimpleArray<ON_3fPoint>.m_a + lVar22),
                          iVar19 != 0 || (uVar21 != (uint)(this->m_topv_map).m_a[lVar22]))))
                      goto LAB_00513ca3;
                      *(undefined1 *)((long)__s + lVar22) = 1;
                      lVar24 = lVar24 + 1;
                    } while (lVar24 < pOVar25->m_v_count);
                  }
                  iVar19 = pOVar25->m_tope_count;
                  if ((long)iVar19 < 0) goto LAB_00513ca3;
                  piVar27 = pOVar25->m_topei;
                  bVar18 = false;
                  if ((iVar19 == 0 && piVar27 != (int *)0x0) ||
                     (iVar19 != 0 && piVar27 == (int *)0x0)) goto LAB_00513ca5;
                  if (iVar19 != 0) {
                    pOVar14 = (this->m_tope).m_a;
                    lVar24 = 0;
                    do {
                      iVar6 = piVar27[lVar24];
                      lVar22 = (long)iVar6;
                      bVar18 = false;
                      if ((lVar22 < 0) || ((int)uVar5 <= iVar6)) goto LAB_00513ca5;
                      if ((uVar21 != (uint)pOVar14[lVar22].m_topvi[0]) &&
                         (uVar21 != (uint)pOVar14[lVar22].m_topvi[1])) goto LAB_00513ca3;
                      if (lVar24 != 0) {
                        lVar22 = 0;
                        do {
                          if (piVar27[lVar22] == iVar6) goto LAB_00513ca3;
                          lVar22 = lVar22 + 1;
                        } while (lVar24 != lVar22);
                      }
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != iVar19);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar3);
              }
              if (0 < mesh_vertex_count) {
                pOVar25 = (this->m_topv).m_a;
                sVar20 = 0;
                do {
                  if ((*(char *)((long)__s + sVar20) != '\x01') ||
                     (uVar7 = (this->m_topv_map).m_a[sVar20], uVar3 <= uVar7)) goto LAB_00513ca3;
                  uVar21 = (ulong)pOVar25[(int)uVar7].m_v_count;
                  bVar18 = 0 < (long)uVar21;
                  if ((long)uVar21 < 1) goto LAB_00513ca3;
                  puVar15 = (uint *)pOVar25[(int)uVar7].m_vi;
                  if (sVar20 != *puVar15) {
                    uVar23 = 0;
                    do {
                      if (uVar21 - 1 == uVar23) goto LAB_00513ca3;
                      lVar24 = uVar23 + 1;
                      uVar23 = uVar23 + 1;
                    } while (sVar20 != puVar15[lVar24]);
                    bVar18 = uVar23 < uVar21;
                  }
                  if (!bVar18) goto LAB_00513ca3;
                  sVar20 = sVar20 + 1;
                } while (sVar20 != size);
              }
              if (0 < (int)uVar5) {
                pOVar25 = (this->m_topv).m_a;
                pOVar14 = (this->m_tope).m_a;
                pOVar16 = (this->m_topf).m_a;
                uVar21 = 0;
                do {
                  uVar7 = pOVar14[uVar21].m_topvi[0];
                  if (uVar3 <= uVar7) goto LAB_00513ca3;
                  uVar8 = pOVar14[uVar21].m_topvi[1];
                  bVar18 = false;
                  if ((uVar3 <= uVar8) || (uVar7 == uVar8)) goto LAB_00513ca5;
                  uVar23 = (ulong)pOVar25[(int)uVar7].m_tope_count;
                  bVar18 = 0 < (long)uVar23;
                  if ((long)uVar23 < 1) goto LAB_00513ca3;
                  if (uVar21 != (uint)*pOVar25[(int)uVar7].m_topei) {
                    uVar26 = 0;
                    do {
                      if (uVar23 - 1 == uVar26) goto LAB_00513ca3;
                      lVar24 = uVar26 + 1;
                      uVar26 = uVar26 + 1;
                    } while (uVar21 != (uint)pOVar25[(int)uVar7].m_topei[lVar24]);
                    bVar18 = uVar26 < uVar23;
                  }
                  if (!bVar18) goto LAB_00513ca3;
                  uVar23 = (ulong)pOVar25[(int)uVar8].m_tope_count;
                  bVar18 = 0 < (long)uVar23;
                  if ((long)uVar23 < 1) goto LAB_00513ca3;
                  if (uVar21 != (uint)*pOVar25[(int)uVar8].m_topei) {
                    uVar26 = 0;
                    do {
                      if (uVar23 - 1 == uVar26) goto LAB_00513ca3;
                      lVar24 = uVar26 + 1;
                      uVar26 = uVar26 + 1;
                    } while (uVar21 != (uint)pOVar25[(int)uVar8].m_topei[lVar24]);
                    bVar18 = uVar26 < uVar23;
                  }
                  if (!bVar18) goto LAB_00513ca3;
                  iVar19 = pOVar14[uVar21].m_topf_count;
                  if ((long)iVar19 < 0) goto LAB_00513ca3;
                  piVar27 = pOVar14[uVar21].m_topfi;
                  bVar18 = false;
                  if ((iVar19 == 0 && piVar27 != (int *)0x0) ||
                     (iVar19 != 0 && piVar27 == (int *)0x0)) goto LAB_00513ca5;
                  if (iVar19 != 0) {
                    lVar24 = 0;
                    do {
                      lVar22 = (long)piVar27[lVar24];
                      bVar18 = false;
                      if ((lVar22 < 0) || ((int)uVar4 <= piVar27[lVar24])) goto LAB_00513ca5;
                      if (uVar21 != (uint)pOVar16[lVar22].m_topei[0]) {
                        uVar23 = 0xffffffffffffffff;
                        do {
                          if (uVar23 == 2) goto LAB_00513ca3;
                          lVar17 = uVar23 + 2;
                          uVar23 = uVar23 + 1;
                        } while (uVar21 != (uint)pOVar16[lVar22].m_topei[lVar17]);
                        if (2 < uVar23) goto LAB_00513ca3;
                      }
                      lVar24 = lVar24 + 1;
                    } while (lVar24 != iVar19);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar5);
              }
              if (0 < (int)uVar4) {
                pOVar16 = (this->m_topf).m_a;
                piVar27 = (this->m_topv_map).m_a;
                local_78 = (this->m_mesh->m_F).m_a;
                pOVar14 = (this->m_tope).m_a;
                uVar21 = 0;
                do {
                  iVar19 = pOVar16[uVar21].m_topei[0];
                  bVar18 = false;
                  if ((iVar19 < 0) || ((int)uVar5 <= iVar19)) goto LAB_00513ca5;
                  pOVar1 = pOVar16 + uVar21;
                  iVar6 = pOVar1->m_topei[1];
                  bVar18 = false;
                  if ((iVar6 < 0) || ((int)uVar5 <= iVar6)) goto LAB_00513ca5;
                  iVar9 = pOVar1->m_topei[2];
                  bVar18 = false;
                  if ((iVar9 < 0) || ((int)uVar5 <= iVar9)) goto LAB_00513ca5;
                  iVar10 = pOVar1->m_topei[3];
                  bVar18 = false;
                  if ((iVar10 < 0) || ((int)uVar5 <= iVar10)) goto LAB_00513ca5;
                  this_00 = local_78 + uVar21;
                  local_98[0] = piVar27[this_00->vi[0]];
                  local_98[1] = piVar27[this_00->vi[1]];
                  iVar11 = this_00->vi[2];
                  local_98[2] = piVar27[iVar11];
                  iVar12 = this_00->vi[3];
                  local_98[3] = piVar27[iVar12];
                  if (((iVar6 != 0 || iVar19 != 0) || iVar9 != 0) || iVar10 != 0) {
                    local_80 = pOVar1;
                    local_70 = piVar27;
                    bVar18 = ON_MeshFace::IsValid(this_00,mesh_vertex_count);
                    if (!bVar18) goto LAB_00513ca3;
                    if (iVar11 == iVar12) {
                      lVar24 = 3;
                      if (iVar9 != iVar10) goto LAB_00513ca3;
                    }
                    else {
                      lVar24 = 4;
                      if (iVar9 == iVar10) goto LAB_00513ca3;
                    }
                    lVar22 = 0;
                    do {
                      uVar23 = (ulong)pOVar14[local_80->m_topei[lVar22]].m_topf_count;
                      bVar18 = 0 < (long)uVar23;
                      if ((long)uVar23 < 1) goto LAB_00513ca3;
                      pOVar2 = pOVar14 + local_80->m_topei[lVar22];
                      if (uVar21 != (uint)*pOVar2->m_topfi) {
                        uVar26 = 0;
                        do {
                          if (uVar23 - 1 == uVar26) goto LAB_00513ca3;
                          lVar17 = uVar26 + 1;
                          uVar26 = uVar26 + 1;
                        } while (uVar21 != (uint)pOVar2->m_topfi[lVar17]);
                        bVar18 = uVar26 < uVar23;
                      }
                      if (!bVar18) goto LAB_00513ca3;
                      if (local_80->m_reve[lVar22] == '\0') {
                        if (pOVar2->m_topvi[0] != local_98[(int)lVar22 - 1U & 3]) goto LAB_00513ca3;
                        iVar19 = pOVar2->m_topvi[1];
                      }
                      else {
                        if (pOVar2->m_topvi[1] != local_98[(int)lVar22 - 1U & 3]) goto LAB_00513ca3;
                        iVar19 = pOVar2->m_topvi[0];
                      }
                      if (iVar19 != local_98[lVar22]) goto LAB_00513ca3;
                      lVar22 = lVar22 + 1;
                      piVar27 = local_70;
                    } while (lVar22 != lVar24);
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar4);
              }
              bVar18 = true;
            }
          }
        }
        goto LAB_00513ca5;
      }
    }
  }
LAB_00513ca3:
  bVar18 = false;
LAB_00513ca5:
  ON_Workspace::~ON_Workspace(&local_68);
  return bVar18;
}

Assistant:

bool ON_MeshTopology::IsValid() const
{
  ON_Workspace ws;
  int topvi, topei, topfi, vi, fi, j, jmax, k, tfvi[4];
  ON_3fPoint p;

  WaitUntilReady(0);

  // simple checks
  if ( 1 != m_b32IsValid )
    return false;
  if ( !m_mesh )
    return false;
  if ( this != &(m_mesh->Topology()) )
    return false;
  const int v_count = m_mesh->VertexCount();
  const int f_count = m_mesh->FaceCount();
  const int topv_count = TopVertexCount();
  const int tope_count = TopEdgeCount();
  const int topf_count = TopFaceCount();
  if ( topv_count > v_count || topv_count < 0 )
    return false;
  if ( topv_count == 0 && v_count > 0 )
    return false;
  if ( topf_count != f_count )
    return false;
  if ( f_count > 0 && tope_count < 3 )
    return false;
  if ( m_topv_map.Count() != v_count )
    return false;

  // check vertex information
  for ( vi = 0; vi < v_count; vi++ ) {
    topvi = m_topv_map[vi];
    if ( topvi < 0 || topvi >= topv_count )
      return false;
  }

  char* vCheck = (char*)ws.GetMemory( v_count*sizeof(*vCheck) );
  memset( vCheck, 0, v_count*sizeof(*vCheck) );
  for ( topvi = 0; topvi < topv_count; topvi++ )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    if ( topv.m_v_count <= 0 )
      return false;
    if ( !topv.m_vi )
      return false;
    p = TopVertexPoint(topvi);
    for ( j = 0; j < topv.m_v_count; j++ ) {
      vi = topv.m_vi[j];
      if ( vi < 0 )
        return false;
      if ( vi >= v_count )
        return false;
      if ( vCheck[vi] != 0 )
        return false; // mesh.m_V[vi] is referenced multiple times
      if ( compare3fPoint( &p, &m_mesh->m_V[vi] ) )
        return false; // mesh.m_V[vi] not at same location as topv
      if ( m_topv_map[vi] != topvi )
        return false; 
      vCheck[vi] = 1;
    }

    // check that edges in m_topei[] list have topvi has a start/end
    if ( topv.m_tope_count < 0 )
      return false;
    if ( topv.m_tope_count == 0 && topv.m_topei )
      return false; // array should be nullptr
    if ( topv.m_tope_count > 0 && !topv.m_topei )
      return false; // array should not be nullptr
    for ( j = 0; j < topv.m_tope_count; j++ ) {
      topei = topv.m_topei[j];
      if ( topei < 0 )
        return false;
      if ( topei >= tope_count )
        return false;
      const ON_MeshTopologyEdge& tope = m_tope[topei];
      if ( tope.m_topvi[0] != topvi && tope.m_topvi[1] != topvi )
        return false; // edge doesn't reference this top vtx
      for ( k = 0; k < j; k++ ) {
        if ( topv.m_topei[k] == topei )
          return false; // edge listed multiple times
      }
    }
  }

  // make sure every mesh.m_V[] maps to a topological vertex
  for ( vi = 0; vi < v_count; vi++ ) {
    if ( vCheck[vi] != 1 )
      return false; // mesh.m_V[vi] is not referenced
    topvi = m_topv_map[vi];
    if ( topvi < 0 )
      return false;
    if ( topvi >= topv_count )
      return false;
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    for ( j = 0; j < topv.m_v_count; j++ ) {
      if ( topv.m_vi[j] == vi )
        break;
    }
    if ( j >= topv.m_v_count )
      return false; // bogus m_topv_map[] array
  }

  // check edges
  for ( topei = 0; topei < tope_count; topei++ ) {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    if ( tope.m_topvi[0] < 0 || tope.m_topvi[0] >= topv_count )
      return false;
    if ( tope.m_topvi[1] < 0 || tope.m_topvi[1] >= topv_count )
      return false;
    if ( tope.m_topvi[0] == tope.m_topvi[1] )
      return false;

    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    for ( j = 0; j < topv0.m_tope_count; j++ ) {
      if ( topv0.m_topei[j] == topei )
        break;
    }
    if ( j >= topv0.m_tope_count )
      return false; // start vtx not linked to edge

    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    for ( j = 0; j < topv1.m_tope_count; j++ ) {
      if ( topv1.m_topei[j] == topei )
        break;
    }
    if ( j >= topv1.m_tope_count )
      return false; // end vtx not linked to edge

    if ( tope.m_topf_count < 0 )
      return false;
    if ( tope.m_topf_count == 0 && tope.m_topfi )
      return false; // array should be nullptr
    if ( tope.m_topf_count > 0 && !tope.m_topfi )
      return false; // array should not be nullptr
    for ( j = 0; j < tope.m_topf_count; j++ ) {
      fi = tope.m_topfi[j];
      if ( fi < 0 || fi >= f_count )
        return false;
      const ON_MeshTopologyFace& topf = m_topf[fi];
      for ( k = 0; k < 4; k++ ) {
        if ( topf.m_topei[k] == topei )
          break;
      }
      if ( k >= 4 )
        return false; // edge not in face's list
    }
  }

  // check faces
  for ( fi = 0; fi < f_count; fi++ ) {
    topfi = fi;
    const ON_MeshTopologyFace& topf = m_topf[topfi];
    const ON_MeshFace& f = m_mesh->m_F[fi];
    if ( topf.m_topei[0] < 0 || topf.m_topei[0] >= tope_count )
      return false;
    if ( topf.m_topei[1] < 0 || topf.m_topei[1] >= tope_count )
      return false;
    if ( topf.m_topei[2] < 0 || topf.m_topei[2] >= tope_count )
      return false;
    if ( topf.m_topei[3] < 0 || topf.m_topei[3] >= tope_count )
      return false;
    tfvi[0] = m_topv_map[f.vi[0]];
    tfvi[1] = m_topv_map[f.vi[1]];
    tfvi[2] = m_topv_map[f.vi[2]];
    tfvi[3] = m_topv_map[f.vi[3]];
    if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
         || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 ) {
      if ( !f.IsValid(v_count) )
        return false;
      if ( f.IsTriangle() ) {
        if (topf.m_topei[2] != topf.m_topei[3] )
          return false;
        jmax = 3;
      }
      else {
        if (topf.m_topei[2] == topf.m_topei[3] )
          return false;
        jmax = 4;
      }
      for ( j = 0; j < jmax; j++ ) {
        const ON_MeshTopologyEdge& tope = m_tope[topf.m_topei[j]];
        for ( k = 0; k < tope.m_topf_count; k++ ) {
          if ( tope.m_topfi[k] == topfi )
            break;
        }
        if ( k >= tope.m_topf_count )
          return false;

        // topedge m_tope[topf.m_topei[j]] ENDS at topvtx m_topv[tfvi[j]]
        if ( topf.m_reve[j] ) {
          if ( tope.m_topvi[1] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[0] != tfvi[j] )
            return false;
        }
        else {
          if ( tope.m_topvi[0] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[1] != tfvi[j] )
            return false;
        }
      }      
    }
    else {
      // all topf.m_topei[] must be zeros
      if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
           || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 )
        return false;
    }
  }
  return true;
}